

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

Clifford * inverse(Clifford *__return_storage_ptr__,Clifford *A)

{
  pointer *ppBVar1;
  iterator __position;
  float fVar2;
  Clifford xb;
  Clifford inv;
  Clifford temp;
  Clifford local_128;
  vector<Blade,_std::allocator<Blade>_> local_110;
  vector<Blade,_std::allocator<Blade>_> local_f8;
  vector<Blade,_std::allocator<Blade>_> local_e0;
  Clifford local_c8;
  vector<Blade,_std::allocator<Blade>_> local_b0;
  vector<Blade,_std::allocator<Blade>_> local_98;
  Clifford local_80;
  vector<Blade,_std::allocator<Blade>_> local_68;
  vector<Blade,_std::allocator<Blade>_> local_50;
  vector<Blade,_std::allocator<Blade>_> local_38;
  
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_38,A);
  if (local_38.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_38.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar2 = 0.0;
  }
  else {
    fVar2 = (local_38.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
             super__Vector_impl_data._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_38);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_68,A);
  while( true ) {
    if (local_68.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_68.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_68);
      (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Blade::Blade((Blade *)&local_128,0,1.0 / fVar2);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                  (__return_storage_ptr__,__position,(Blade *)&local_128);
      }
      else {
        *__position._M_current =
             (Blade)local_128.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
      }
      Blade::~Blade((Blade *)&local_128);
      return __return_storage_ptr__;
    }
    if ((1e-06 < ABS((local_68.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                      super__Vector_impl_data._M_start)->mVal)) &&
       ((local_68.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
        _M_start)->mBase != 0)) break;
    local_68.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
    _M_start = local_68.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_68);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_50,A);
  operator!(&local_128,&local_50);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_50);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_98,A);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_b0,&local_128);
  operator|(&local_80,&local_98,&local_b0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_b0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_98);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_e0,&local_80);
  inverse(&local_c8,&local_e0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_e0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_f8,&local_128);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_110,&local_c8);
  operator*(__return_storage_ptr__,&local_f8,&local_110);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_110);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_f8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_80);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_128);
  return __return_storage_ptr__;
}

Assistant:

Clifford inverse(Clifford A)
{
	float sk; sk<=A;

	if(isScalar(A))
	{
		Clifford result;
		result.push_back(Blade(0, 1.0 / sk));
		return result;
	}

	Clifford xb = !A;
	Clifford temp = A|xb;
	Clifford inv = inverse(temp);
	return (xb*inv);
}